

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall node::anon_unknown_2::NodeImpl::getNodesStats(NodeImpl *this,NodesStats *stats)

{
  CConnman *this_00;
  long lVar1;
  PeerManager *pPVar2;
  pointer pCVar3;
  int iVar4;
  tuple<CNodeStats,_bool,_CNodeStateStats> *node_stats;
  long lVar5;
  pointer __args;
  NodesStats *__range5;
  long in_FS_OFFSET;
  bool local_c9;
  vector<CNodeStats,_std::allocator<CNodeStats>_> stats_temp;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> lockMain;
  _Vector_base<int,_std::allocator<int>_> local_90;
  undefined8 uStack_78;
  CAmount local_70;
  uint64_t uStack_68;
  uint64_t local_60;
  undefined8 uStack_58;
  ServiceFlags local_50;
  int64_t local_48;
  seconds local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::tuple<CNodeStats,_bool,_CNodeStateStats>,_std::allocator<std::tuple<CNodeStats,_bool,_CNodeStateStats>_>_>
  ::clear(stats);
  this_00 = (this->m_context->connman)._M_t.
            super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
            super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
            super__Head_base<0UL,_CConnman_*,_false>._M_head_impl;
  if (this_00 != (CConnman *)0x0) {
    stats_temp.super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    stats_temp.super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    stats_temp.super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CConnman::GetNodeStats(this_00,&stats_temp);
    std::
    vector<std::tuple<CNodeStats,_bool,_CNodeStateStats>,_std::allocator<std::tuple<CNodeStats,_bool,_CNodeStateStats>_>_>
    ::reserve(stats,((long)stats_temp.super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)stats_temp.super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x1c8);
    pCVar3 = stats_temp.super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__args = stats_temp.super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>._M_impl.
                  super__Vector_impl_data._M_start; __args != pCVar3; __args = __args + 1) {
      local_70 = 0;
      uStack_78._0_1_ = false;
      uStack_78._1_7_ = 0;
      local_50 = NODE_NONE;
      lockMain.super_unique_lock._M_device = (mutex_type *)0xffffffffffffffff;
      lockMain.super_unique_lock._M_owns = true;
      lockMain.super_unique_lock._9_7_ = 0xffffff;
      local_90._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_90._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uStack_58._0_1_ = false;
      uStack_58._1_7_ = 0;
      uStack_68 = 0;
      local_60 = 0;
      local_48 = -1;
      local_c9 = false;
      local_40.__r = 0;
      std::
      vector<std::tuple<CNodeStats,bool,CNodeStateStats>,std::allocator<std::tuple<CNodeStats,bool,CNodeStateStats>>>
      ::emplace_back<CNodeStats,bool,CNodeStateStats>
                ((vector<std::tuple<CNodeStats,bool,CNodeStateStats>,std::allocator<std::tuple<CNodeStats,bool,CNodeStateStats>>>
                  *)stats,__args,&local_c9,(CNodeStateStats *)&lockMain);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
    }
    if ((this->m_context->peerman)._M_t.
        super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
        super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
        super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl != (PeerManager *)0x0) {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&lockMain,&cs_main,"::cs_main",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                 ,0xcc,true);
      if (lockMain.super_unique_lock._M_owns == true) {
        lVar1 = *(long *)(stats + 8);
        for (lVar5 = *(long *)stats; lVar5 != lVar1; lVar5 = lVar5 + 0x240) {
          pPVar2 = (this->m_context->peerman)._M_t.
                   super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
                   super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
                   super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
          iVar4 = (*(pPVar2->super_CValidationInterface)._vptr_CValidationInterface[0xe])
                            (pPVar2,*(undefined8 *)(lVar5 + 0x78),lVar5);
          *(char *)(lVar5 + 0x70) = (char)iVar4;
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&lockMain.super_unique_lock);
    }
    std::vector<CNodeStats,_std::allocator<CNodeStats>_>::~vector(&stats_temp);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00 != (CConnman *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool getNodesStats(NodesStats& stats) override
    {
        stats.clear();

        if (m_context->connman) {
            std::vector<CNodeStats> stats_temp;
            m_context->connman->GetNodeStats(stats_temp);

            stats.reserve(stats_temp.size());
            for (auto& node_stats_temp : stats_temp) {
                stats.emplace_back(std::move(node_stats_temp), false, CNodeStateStats());
            }

            // Try to retrieve the CNodeStateStats for each node.
            if (m_context->peerman) {
                TRY_LOCK(::cs_main, lockMain);
                if (lockMain) {
                    for (auto& node_stats : stats) {
                        std::get<1>(node_stats) =
                            m_context->peerman->GetNodeStateStats(std::get<0>(node_stats).nodeid, std::get<2>(node_stats));
                    }
                }
            }
            return true;
        }
        return false;
    }